

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O1

void __thiscall
TEST_DoublingFactorCounterTest_Not_SevenPairs_FourSuit_TestShell::
~TEST_DoublingFactorCounterTest_Not_SevenPairs_FourSuit_TestShell
          (TEST_DoublingFactorCounterTest_Not_SevenPairs_FourSuit_TestShell *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, Not_SevenPairs_FourSuit)
{
	addPair(Tile::EastWind);
	addPair(Tile::NorthWind);
	addPair(Tile::ThreeOfCharacters);
	addPair(Tile::NineOfCircles);
	addPair(Tile::OneOfBamboos);
	addPair(Tile::GreenDragon);
	addPair(Tile::GreenDragon);

	s.winByDiscard();
	auto r = c.report();

	CHECK_EQUAL(0, r.patterns.count(Pattern::SevenPairs));
}